

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgenericitemmodel.cpp
# Opt level: O2

void QGenericItemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  (*_o->_vptr_QObject[0x30])();
  return;
}

Assistant:

void QGenericItemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGenericItemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->resetInternalData(); break;
        default: ;
        }
    }
    (void)_a;
}